

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

unsigned_long_long __thiscall QPDFObjectHandle::getUIntValue(QPDFObjectHandle *this)

{
  unsigned_long_long uVar1;
  allocator<char> local_31;
  string local_30;
  
  uVar1 = getIntValue(this);
  if ((long)uVar1 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"unsigned value request for negative number; returning 0",
               &local_31);
    warnIfPossible(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned long long
QPDFObjectHandle::getUIntValue() const
{
    long long v = getIntValue();
    if (v < 0) {
        QTC::TC("qpdf", "QPDFObjectHandle uint returning 0");
        warnIfPossible("unsigned value request for negative number; returning 0");
        return 0;
    } else {
        return static_cast<unsigned long long>(v);
    }
}